

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraph.cpp
# Opt level: O2

void __thiscall ControlFlowGraph::printWithRegions(ControlFlowGraph *this,ostream *ostream)

{
  std::operator<<(ostream,"digraph \"Control Flow Graph\" {\n");
  std::operator<<(ostream,"compound = true\n");
  ThreadRegionsBuilder::printNodes
            ((this->threadRegionsBuilder)._M_t.
             super___uniq_ptr_impl<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_ThreadRegionsBuilder_*,_std::default_delete<ThreadRegionsBuilder>_>
             .super__Head_base<0UL,_ThreadRegionsBuilder_*,_false>._M_head_impl,ostream);
  GraphBuilder::printEdges
            ((this->graphBuilder)._M_t.
             super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>._M_t.
             super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
             super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl,ostream);
  ThreadRegionsBuilder::printEdges
            ((this->threadRegionsBuilder)._M_t.
             super___uniq_ptr_impl<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_ThreadRegionsBuilder_*,_std::default_delete<ThreadRegionsBuilder>_>
             .super__Head_base<0UL,_ThreadRegionsBuilder_*,_false>._M_head_impl,ostream);
  std::operator<<(ostream,"}\n");
  return;
}

Assistant:

void ControlFlowGraph::printWithRegions(std::ostream &ostream) const {
    ostream << "digraph \"Control Flow Graph\" {\n";
    ostream << "compound = true\n";

    threadRegionsBuilder->printNodes(ostream);
    graphBuilder->printEdges(ostream);
    threadRegionsBuilder->printEdges(ostream);

    ostream << "}\n";
}